

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O2

int ReadUntilRS232Port(RS232PORT *pRS232Port,uint8 *readbuf,char endchar,int maxreadbuflen)

{
  uint in_EAX;
  int iVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  ulong uStack_38;
  int Bytes;
  
  uStack_38 = (ulong)in_EAX;
  uVar2 = 0;
  while( true ) {
    if ((0 < (int)uVar2) &&
       ((uint)readbuf[(ulong)uVar2 - 1] == (uint)CONCAT71(in_register_00000011,endchar))) {
      return 0;
    }
    if (maxreadbuflen <= (int)uVar2) {
      return 6;
    }
    iVar1 = ReadRS232Port(pRS232Port,readbuf + (int)uVar2,1,&Bytes);
    if (iVar1 != 0) break;
    uVar2 = uVar2 + Bytes;
    if (Bytes == 0) {
      return 2;
    }
  }
  return 1;
}

Assistant:

inline int ReadUntilRS232Port(RS232PORT* pRS232Port, uint8* readbuf, char endchar, int maxreadbuflen)
{
	int BytesReceived = 0;
	int Bytes = 0;

	// Receive byte per byte.
	while ((BytesReceived <= 0)||(readbuf[BytesReceived-1] != endchar))
	{
		if (BytesReceived >= maxreadbuflen)
		{
			PRINT_DEBUG_ERROR_RS232PORT(("ReadUntilRS232Port error (%s) : %s"
				"(pRS232Port=%#x, readbuf=%#x, endchar=%.2x, maxreadbuflen=%d)\n", 
				strtime_m(), 
				"readbuf full. ", 
				pRS232Port, readbuf, (int)(unsigned char)endchar, maxreadbuflen));
			PRINT_DEBUG_MESSAGE_RS232PORT(("Total bytes received : %d\n", BytesReceived));
			return EXIT_OUT_OF_MEMORY;
		}

		// Receive 1 byte.
		if (ReadRS232Port(pRS232Port, readbuf + BytesReceived, 1, &Bytes) == EXIT_SUCCESS)
		{
			if (Bytes == 0)
			{
				PRINT_DEBUG_WARNING_RS232PORT(("ReadUntilRS232Port warning (%s) : %s"
					"(pRS232Port=%#x, readbuf=%#x, endchar=%.2x, maxreadbuflen=%d)\n", 
					strtime_m(), 
					szOSUtilsErrMsgs[EXIT_TIMEOUT], 
					pRS232Port, readbuf, (int)(unsigned char)endchar, maxreadbuflen));
				PRINT_DEBUG_MESSAGE_RS232PORT(("Total bytes received : %d\n", BytesReceived));
				return EXIT_TIMEOUT;
			}
			else
			{
				PRINT_DEBUG_MESSAGE_RS232PORT(("Bytes received : %d\n", Bytes));
			}
		}
		else
		{
			PRINT_DEBUG_ERROR_RS232PORT(("ReadUntilRS232Port error (%s) : %s"
				"(pRS232Port=%#x, readbuf=%#x, endchar=%.2x, maxreadbuflen=%d)\n", 
				strtime_m(), 
				"ReadRS232Port failed. ", 
				pRS232Port, readbuf, (int)(unsigned char)endchar, maxreadbuflen));
			PRINT_DEBUG_MESSAGE_RS232PORT(("Total bytes received : %d\n", BytesReceived));
			return EXIT_FAILURE;
		}

		BytesReceived += Bytes;
	}

	PRINT_DEBUG_MESSAGE_RS232PORT(("Total bytes received : %d\n", BytesReceived));

	//*pBytesReceived = BytesReceived;

	return EXIT_SUCCESS;
}